

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void lyxp_set_scnode_merge(lyxp_set *set1,lyxp_set *set2)

{
  long *plVar1;
  int iVar2;
  lyxp_set_scnode *plVar3;
  long lVar4;
  uint uVar5;
  lyxp_set_node *plVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  if ((set1->type != LYXP_SET_SCNODE_SET) || (set2->type != LYXP_SET_SCNODE_SET)) {
    __assert_fail("(set1->type == LYXP_SET_SCNODE_SET) && (set2->type == LYXP_SET_SCNODE_SET)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x4ed,"void lyxp_set_scnode_merge(struct lyxp_set *, struct lyxp_set *)");
  }
  if (set2->used != 0) {
    uVar5 = set1->used;
    if (uVar5 == 0) {
      lyxp_set_free_content(set1);
      memcpy(set1,set2,0x90);
      return;
    }
    uVar7 = set2->used + uVar5;
    if (set1->size < uVar7) {
      set1->size = uVar7;
      plVar6 = (lyxp_set_node *)ly_realloc((set1->val).nodes,(ulong)uVar7 * 0x18);
      (set1->val).nodes = plVar6;
      if (plVar6 == (lyxp_set_node *)0x0) {
        ly_log(set1->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxp_set_scnode_merge"
              );
        return;
      }
      uVar5 = set1->used;
    }
    uVar8 = (ulong)uVar5;
    for (uVar9 = 0; uVar9 < set2->used; uVar9 = uVar9 + 1) {
      plVar3 = (set1->val).scnodes;
      plVar6 = (set2->val).nodes;
      lVar10 = uVar9 * 0x18;
      plVar1 = (long *)((long)plVar6 + lVar10);
      lVar4 = 0;
      do {
        lVar11 = lVar4;
        if (uVar8 * 0x18 + 0x18 == lVar11 + 0x18) {
          *(long *)&plVar3[uVar5].axis = plVar1[2];
          lVar4 = plVar1[1];
          plVar3 = plVar3 + uVar5;
          plVar3->scnode = (lysc_node *)*plVar1;
          plVar3->type = (int)lVar4;
          plVar3->in_ctx = (int)((ulong)lVar4 >> 0x20);
          uVar5 = set1->used + 1;
          set1->used = uVar5;
          goto LAB_00199d73;
        }
        lVar4 = lVar11 + 0x18;
      } while (*(long *)((long)&plVar3->scnode + lVar11) != *plVar1);
      iVar2 = *(int *)((long)&plVar3->in_ctx + lVar11);
      if (iVar2 == 0) {
        if (*(int *)((long)plVar6 + lVar10 + 0xc) == 1) {
          *(undefined4 *)((long)&plVar3->in_ctx + lVar11) = 1;
        }
      }
      else if (iVar2 == -1) {
        *(undefined4 *)((long)&plVar3->in_ctx + lVar11) =
             *(undefined4 *)((long)plVar6 + lVar10 + 0xc);
      }
LAB_00199d73:
    }
    lyxp_set_free_content(set2);
    set2->type = LYXP_SET_SCNODE_SET;
  }
  return;
}

Assistant:

void
lyxp_set_scnode_merge(struct lyxp_set *set1, struct lyxp_set *set2)
{
    uint32_t orig_used, i, j;

    assert((set1->type == LYXP_SET_SCNODE_SET) && (set2->type == LYXP_SET_SCNODE_SET));

    if (!set2->used) {
        return;
    }

    if (!set1->used) {
        /* release hidden allocated data (lyxp_set.size) */
        lyxp_set_free_content(set1);
        /* direct copying of the entire structure */
        memcpy(set1, set2, sizeof *set1);
        return;
    }

    if (set1->used + set2->used > set1->size) {
        set1->size = set1->used + set2->used;
        set1->val.scnodes = ly_realloc(set1->val.scnodes, set1->size * sizeof *set1->val.scnodes);
        LY_CHECK_ERR_RET(!set1->val.scnodes, LOGMEM(set1->ctx), );
    }

    orig_used = set1->used;

    for (i = 0; i < set2->used; ++i) {
        for (j = 0; j < orig_used; ++j) {
            /* detect duplicities */
            if (set1->val.scnodes[j].scnode == set2->val.scnodes[i].scnode) {
                break;
            }
        }

        if (j < orig_used) {
            /* node is there, but update its status if needed */
            if (set1->val.scnodes[j].in_ctx == LYXP_SET_SCNODE_START_USED) {
                set1->val.scnodes[j].in_ctx = set2->val.scnodes[i].in_ctx;
            } else if ((set1->val.scnodes[j].in_ctx == LYXP_SET_SCNODE_ATOM_NODE) &&
                    (set2->val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_VAL)) {
                set1->val.scnodes[j].in_ctx = set2->val.scnodes[i].in_ctx;
            }
        } else {
            memcpy(&set1->val.scnodes[set1->used], &set2->val.scnodes[i], sizeof *set2->val.scnodes);
            ++set1->used;
        }
    }

    lyxp_set_free_content(set2);
    set2->type = LYXP_SET_SCNODE_SET;
}